

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O3

void __thiscall
slang::parsing::Parser::checkEmptyBody
          (Parser *this,SyntaxNode *syntax,Token prevToken,string_view syntaxName)

{
  bool bVar1;
  SourceLocation location;
  Diagnostic *this_00;
  
  if (((((prevToken._0_4_ >> 0x10 & 1) == 0 && syntax->kind == EmptyStatement) &&
       (*(long *)(syntax + 1) == 0)) && (syntax[3].parent == (SyntaxNode *)0x0)) &&
     (((ulong)syntax[3].previewNode & 0x10000) == 0)) {
    bVar1 = Token::isOnSameLine((Token *)&syntax[3].previewNode);
    if (bVar1) {
      location = Token::location((Token *)&syntax[3].previewNode);
      this_00 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xc50005,location);
      Diagnostic::operator<<(this_00,syntaxName);
      return;
    }
  }
  return;
}

Assistant:

void Parser::checkEmptyBody(const SyntaxNode& syntax, Token prevToken,
                            std::string_view syntaxName) {
    if (syntax.kind != SyntaxKind::EmptyStatement || prevToken.isMissing())
        return;

    auto& ess = syntax.as<EmptyStatementSyntax>();
    if (ess.label || !ess.attributes.empty() || ess.semicolon.isMissing() ||
        !ess.semicolon.isOnSameLine()) {
        return;
    }

    addDiag(diag::EmptyBody, ess.semicolon.location()) << syntaxName;
}